

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void scalar_test(void)

{
  int iVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  secp256k1_scalar r;
  secp256k1_scalar r1_8;
  secp256k1_scalar r1_7;
  secp256k1_scalar r1_6;
  secp256k1_scalar t_2;
  secp256k1_scalar r2_5;
  secp256k1_scalar r1_5;
  secp256k1_scalar r2_4;
  secp256k1_scalar r1_4;
  secp256k1_scalar r2_3;
  secp256k1_scalar r1_3;
  secp256k1_scalar r2_2;
  secp256k1_scalar r1_2;
  int bit;
  int i_2;
  secp256k1_scalar b;
  secp256k1_scalar r2_1;
  secp256k1_scalar r1_1;
  secp256k1_scalar r2;
  secp256k1_scalar r1;
  int now;
  int j_1;
  secp256k1_scalar t_1;
  int i_1;
  secp256k1_scalar n_1;
  int j;
  secp256k1_scalar t;
  secp256k1_scalar n;
  int i;
  uchar c [32];
  secp256k1_scalar s2;
  secp256k1_scalar s1;
  secp256k1_scalar s;
  uint in_stack_fffffffffffffc88;
  uint in_stack_fffffffffffffc8c;
  uint in_stack_fffffffffffffc90;
  uint32_t in_stack_fffffffffffffc94;
  secp256k1_scalar *in_stack_fffffffffffffc98;
  secp256k1_scalar *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  uint in_stack_fffffffffffffcac;
  secp256k1_scalar *in_stack_fffffffffffffcb0;
  secp256k1_scalar *in_stack_fffffffffffffcb8;
  secp256k1_scalar *in_stack_fffffffffffffcc0;
  secp256k1_scalar *in_stack_fffffffffffffcc8;
  secp256k1_scalar *in_stack_fffffffffffffcd0;
  int local_1cc;
  int local_128;
  int local_124;
  int local_fc;
  int local_d4;
  int local_8c;
  
  testutil_random_scalar_order_test(in_stack_fffffffffffffcb0);
  testutil_random_scalar_order_test(in_stack_fffffffffffffcb0);
  testutil_random_scalar_order_test(in_stack_fffffffffffffcb0);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  secp256k1_scalar_set_int
            ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c);
  for (local_8c = 0; local_8c < 0x100; local_8c = local_8c + 4) {
    secp256k1_scalar_get_bits_limb32
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
    secp256k1_scalar_set_int
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc8c);
    for (local_d4 = 0; local_d4 < 4; local_d4 = local_d4 + 1) {
      secp256k1_scalar_add
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  }
  iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                              (secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7fb,"test condition failed: secp256k1_scalar_eq(&n, &s)");
    abort();
  }
  local_fc = 0;
  secp256k1_scalar_set_int
            ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c);
  for (; local_fc < 0x100; local_fc = local_128 + local_fc) {
    uVar2 = testrand_int(in_stack_fffffffffffffc94);
    local_128 = uVar2 + 1;
    if (0x100 < local_128 + local_fc) {
      local_128 = 0x100 - local_fc;
    }
    secp256k1_scalar_get_bits_var
              (in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc90);
    secp256k1_scalar_set_int
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc8c);
    for (local_124 = 0; local_124 < local_128; local_124 = local_124 + 1) {
      secp256k1_scalar_add
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  }
  iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                              (secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x811,"test condition failed: secp256k1_scalar_eq(&n, &s)");
    abort();
  }
  secp256k1_scalar_add
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  secp256k1_scalar_add
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                              (secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x819,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
    abort();
  }
  uVar3 = testrand_bits(in_stack_fffffffffffffc8c);
  secp256k1_scalar_set_int
            ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c);
  iVar1 = secp256k1_scalar_is_one((secp256k1_scalar *)0x13f4ac);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x823,"test condition failed: secp256k1_scalar_is_one(&b)");
    abort();
  }
  for (local_1cc = 0; local_1cc < (int)uVar3; local_1cc = local_1cc + 1) {
    secp256k1_scalar_add
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  }
  iVar1 = secp256k1_scalar_add
                    (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (iVar1 == 0) {
    secp256k1_scalar_cadd_bit
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
    iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x82c,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
    secp256k1_scalar_cadd_bit
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
    iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x82f,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
  }
  secp256k1_scalar_mul
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  secp256k1_scalar_mul
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                              (secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x838,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
    abort();
  }
  secp256k1_scalar_add
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  secp256k1_scalar_add
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  secp256k1_scalar_add
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  secp256k1_scalar_add
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                              (secp256k1_scalar *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if (iVar1 != 0) {
    secp256k1_scalar_mul
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x84c,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    secp256k1_scalar_add
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x857,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
    secp256k1_scalar_mul
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x85e,"test condition failed: secp256k1_scalar_eq(&r1, &s1)");
      abort();
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (secp256k1_scalar *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (iVar1 != 0) {
      secp256k1_scalar_mul
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                                  CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                  (secp256k1_scalar *)
                                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x86c,"test condition failed: secp256k1_scalar_eq(&r1, &secp256k1_scalar_zero)");
        abort();
      }
      secp256k1_scalar_add
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      secp256k1_scalar_half(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                                  CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                  (secp256k1_scalar *)
                                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (iVar1 != 0) {
        return;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x874,"test condition failed: secp256k1_scalar_eq(&r, &s)");
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x865,"test condition failed: secp256k1_scalar_eq(&r1, &s1)");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x842,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
  abort();
}

Assistant:

static void scalar_test(void) {
    secp256k1_scalar s;
    secp256k1_scalar s1;
    secp256k1_scalar s2;
    unsigned char c[32];

    /* Set 's' to a random scalar, with value 'snum'. */
    testutil_random_scalar_order_test(&s);

    /* Set 's1' to a random scalar, with value 's1num'. */
    testutil_random_scalar_order_test(&s1);

    /* Set 's2' to a random scalar, with value 'snum2', and byte array representation 'c'. */
    testutil_random_scalar_order_test(&s2);
    secp256k1_scalar_get_b32(c, &s2);

    {
        int i;
        /* Test that fetching groups of 4 bits from a scalar and recursing n(i)=16*n(i-1)+p(i) reconstructs it. */
        secp256k1_scalar n;
        secp256k1_scalar_set_int(&n, 0);
        for (i = 0; i < 256; i += 4) {
            secp256k1_scalar t;
            int j;
            secp256k1_scalar_set_int(&t, secp256k1_scalar_get_bits_limb32(&s, 256 - 4 - i, 4));
            for (j = 0; j < 4; j++) {
                secp256k1_scalar_add(&n, &n, &n);
            }
            secp256k1_scalar_add(&n, &n, &t);
        }
        CHECK(secp256k1_scalar_eq(&n, &s));
    }

    {
        /* Test that fetching groups of randomly-sized bits from a scalar and recursing n(i)=b*n(i-1)+p(i) reconstructs it. */
        secp256k1_scalar n;
        int i = 0;
        secp256k1_scalar_set_int(&n, 0);
        while (i < 256) {
            secp256k1_scalar t;
            int j;
            int now = testrand_int(15) + 1;
            if (now + i > 256) {
                now = 256 - i;
            }
            secp256k1_scalar_set_int(&t, secp256k1_scalar_get_bits_var(&s, 256 - now - i, now));
            for (j = 0; j < now; j++) {
                secp256k1_scalar_add(&n, &n, &n);
            }
            secp256k1_scalar_add(&n, &n, &t);
            i += now;
        }
        CHECK(secp256k1_scalar_eq(&n, &s));
    }

    {
        /* Test commutativity of add. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_add(&r1, &s1, &s2);
        secp256k1_scalar_add(&r2, &s2, &s1);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        secp256k1_scalar r1, r2;
        secp256k1_scalar b;
        int i;
        /* Test add_bit. */
        int bit = testrand_bits(8);
        secp256k1_scalar_set_int(&b, 1);
        CHECK(secp256k1_scalar_is_one(&b));
        for (i = 0; i < bit; i++) {
            secp256k1_scalar_add(&b, &b, &b);
        }
        r1 = s1;
        r2 = s1;
        if (!secp256k1_scalar_add(&r1, &r1, &b)) {
            /* No overflow happened. */
            secp256k1_scalar_cadd_bit(&r2, bit, 1);
            CHECK(secp256k1_scalar_eq(&r1, &r2));
            /* cadd is a noop when flag is zero */
            secp256k1_scalar_cadd_bit(&r2, bit, 0);
            CHECK(secp256k1_scalar_eq(&r1, &r2));
        }
    }

    {
        /* Test commutativity of mul. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_mul(&r1, &s1, &s2);
        secp256k1_scalar_mul(&r2, &s2, &s1);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test associativity of add. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_add(&r1, &s1, &s2);
        secp256k1_scalar_add(&r1, &r1, &s);
        secp256k1_scalar_add(&r2, &s2, &s);
        secp256k1_scalar_add(&r2, &s1, &r2);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test associativity of mul. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_mul(&r1, &s1, &s2);
        secp256k1_scalar_mul(&r1, &r1, &s);
        secp256k1_scalar_mul(&r2, &s2, &s);
        secp256k1_scalar_mul(&r2, &s1, &r2);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test distributitivity of mul over add. */
        secp256k1_scalar r1, r2, t;
        secp256k1_scalar_add(&r1, &s1, &s2);
        secp256k1_scalar_mul(&r1, &r1, &s);
        secp256k1_scalar_mul(&r2, &s1, &s);
        secp256k1_scalar_mul(&t, &s2, &s);
        secp256k1_scalar_add(&r2, &r2, &t);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test multiplicative identity. */
        secp256k1_scalar r1;
        secp256k1_scalar_mul(&r1, &s1, &secp256k1_scalar_one);
        CHECK(secp256k1_scalar_eq(&r1, &s1));
    }

    {
        /* Test additive identity. */
        secp256k1_scalar r1;
        secp256k1_scalar_add(&r1, &s1, &secp256k1_scalar_zero);
        CHECK(secp256k1_scalar_eq(&r1, &s1));
    }

    {
        /* Test zero product property. */
        secp256k1_scalar r1;
        secp256k1_scalar_mul(&r1, &s1, &secp256k1_scalar_zero);
        CHECK(secp256k1_scalar_eq(&r1, &secp256k1_scalar_zero));
    }

    {
        /* Test halving. */
        secp256k1_scalar r;
        secp256k1_scalar_add(&r, &s, &s);
        secp256k1_scalar_half(&r, &r);
        CHECK(secp256k1_scalar_eq(&r, &s));
    }
}